

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O2

int contextConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  uint8_t *puVar2;
  
  if (type == 0x82) {
    if (ptr == (void *)0x0) {
      return 8;
    }
    puVar2 = (uint8_t *)(val + 1);
    iVar1 = 8;
  }
  else if (type == 8) {
    if (ptr == (void *)0x0) {
      return 0x82;
    }
    puVar2 = (uint8_t *)(val + 1);
    iVar1 = 0x82;
  }
  else {
    if (type != 0) {
      return -3;
    }
    if (ptr == (void *)0x0) {
      return 0x82;
    }
    iVar1 = 0;
    puVar2 = contextConv::fmt;
  }
  *(uint8_t **)ptr = puVar2;
  return iVar1;
}

Assistant:

static int contextConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(reply_context_defer) *ctx = MPT_baseaddr(reply_context_defer, val, _mt);
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeReplyPtr), MPT_ENUM(TypeReplyDataPtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeReplyPtr);
	}
	if (type == MPT_ENUM(TypeReplyPtr)) {
		if (ptr) *((void **) ptr) = &ctx->_ctx;
		return MPT_ENUM(TypeReplyDataPtr);
	}
	if (type == MPT_ENUM(TypeReplyDataPtr)) {
		if (ptr) *((void **) ptr) = &ctx->_ctx;
		return MPT_ENUM(TypeReplyPtr);
	}
	return MPT_ERROR(BadType);
}